

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.h
# Opt level: O2

bool absl::numbers_internal::safe_strtoi_base<unsigned_long>
               (string_view s,Nonnull<unsigned_long_*> out,int base)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  undefined4 in_register_0000000c;
  int in_R8D;
  string_view text;
  uint64_t val;
  unsigned_long local_18;
  
  text._M_len = s._M_str;
  local_18 = CONCAT71(in_register_00000001,in_AL);
  text._M_str = (char *)&local_18;
  bVar1 = safe_strtou64_base((numbers_internal *)s._M_len,text,
                             (Nonnull<uint64_t_*>)CONCAT44(in_register_0000000c,base),in_R8D);
  *out = local_18;
  return bVar1;
}

Assistant:

ABSL_MUST_USE_RESULT bool safe_strtoi_base(absl::string_view s,
                                           absl::Nonnull<int_type*> out,
                                           int base) {
  static_assert(sizeof(*out) == 4 || sizeof(*out) == 8,
                "SimpleAtoi works only with 32-bit or 64-bit integers.");
  static_assert(!std::is_floating_point<int_type>::value,
                "Use SimpleAtof or SimpleAtod instead.");
  bool parsed;
  // TODO(jorg): This signed-ness check is used because it works correctly
  // with enums, and it also serves to check that int_type is not a pointer.
  // If one day something like std::is_signed<enum E> works, switch to it.
  // These conditions are constexpr bools to suppress MSVC warning C4127.
  constexpr bool kIsSigned = static_cast<int_type>(1) - 2 < 0;
  constexpr bool kUse64Bit = sizeof(*out) == 64 / 8;
  if (kIsSigned) {
    if (kUse64Bit) {
      int64_t val;
      parsed = numbers_internal::safe_strto64_base(s, &val, base);
      *out = static_cast<int_type>(val);
    } else {
      int32_t val;
      parsed = numbers_internal::safe_strto32_base(s, &val, base);
      *out = static_cast<int_type>(val);
    }
  } else {
    if (kUse64Bit) {
      uint64_t val;
      parsed = numbers_internal::safe_strtou64_base(s, &val, base);
      *out = static_cast<int_type>(val);
    } else {
      uint32_t val;
      parsed = numbers_internal::safe_strtou32_base(s, &val, base);
      *out = static_cast<int_type>(val);
    }
  }
  return parsed;
}